

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setStandardInputFile(QProcess *this,QString *fileName)

{
  QProcessPrivate::Channel::operator=
            ((Channel *)
             &(this->super_QIODevice).super_QObject.d_ptr.d[4].bindingStorage.bindingStatus,fileName
            );
  return;
}

Assistant:

void QProcess::setStandardInputFile(const QString &fileName)
{
    Q_D(QProcess);
    d->stdinChannel = fileName;
}